

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcStyledItem::~IfcStyledItem(IfcStyledItem *this)

{
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)((this->Name).ptr.field_2._M_local_buf + lVar2);
  plVar1[-0xb] = (long)&PTR__IfcStyledItem_00887680;
  plVar1[3] = (long)&PTR__IfcStyledItem_008876d0;
  plVar1[-9] = (long)&PTR__IfcStyledItem_008876a8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  pvVar3 = *(void **)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).
                       field_0x20 + lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(&this->field_0x40 + lVar2) - (long)pvVar3);
    return;
  }
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}